

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O1

float ImGuizmo::ComputeAngleOnPlan(void)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar9 = DAT_002002a4 * DAT_00200264 + DAT_0020029c * DAT_0020025c + DAT_002002a0 * DAT_00200260;
  uVar1 = -(uint)(ABS(fVar9) < 1.1920929e-07);
  fVar9 = (float)(uVar1 & 0xbf800000 |
                 ~uVar1 & (uint)(-((DAT_002002a4 * DAT_00200254 +
                                   DAT_0020029c * DAT_0020024c + DAT_002002a0 * DAT_00200250) -
                                  _DAT_002002a8) / fVar9));
  fVar8 = (DAT_0020025c * fVar9 + DAT_0020024c) - DAT_002000ac;
  fVar10 = (DAT_00200260 * fVar9 + DAT_00200250) - DAT_002000b0;
  fVar11 = (fVar9 * DAT_00200264 + DAT_00200254) - DAT_002000b4;
  fVar9 = fVar11 * fVar11 + fVar8 * fVar8 + fVar10 * fVar10;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar9 = 1.0 / fVar9;
  fVar6 = DAT_002002d0 * DAT_002002a4 - DAT_002002a0 * DAT_002002d4;
  fVar7 = DAT_002002d4 * DAT_0020029c - DAT_002002a4 * DAT_002002cc;
  fVar5 = DAT_002002cc * DAT_002002a0 - DAT_0020029c * DAT_002002d0;
  fVar2 = fVar5 * fVar5 + fVar6 * fVar6 + fVar7 * fVar7;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = 1.0 / fVar2;
  fVar3 = DAT_002002d4 * fVar9 * fVar11 +
          DAT_002002cc * fVar8 * fVar9 + DAT_002002d0 * fVar10 * fVar9;
  fVar4 = 0.9999;
  if (fVar3 <= 0.9999) {
    fVar4 = fVar3;
  }
  fVar4 = acosf((float)(-(uint)(fVar3 < -0.9999) & 0xbf7ff972 |
                       ~-(uint)(fVar3 < -0.9999) & (uint)fVar4));
  uVar1 = -(uint)(fVar5 * fVar2 * fVar9 * fVar11 +
                  fVar6 * fVar2 * fVar8 * fVar9 + fVar7 * fVar2 * fVar10 * fVar9 < 0.0);
  return (float)((uint)fVar4 & uVar1 | ~uVar1 & (uint)-fVar4);
}

Assistant:

static float ComputeAngleOnPlan()
   {
      const float len = IntersectRayPlane(gContext.mRayOrigin, gContext.mRayVector, gContext.mTranslationPlan);
      vec_t localPos = Normalized(gContext.mRayOrigin + gContext.mRayVector * len - gContext.mModel.v.position);

      vec_t perpendicularVector;
      perpendicularVector.Cross(gContext.mRotationVectorSource, gContext.mTranslationPlan);
      perpendicularVector.Normalize();
      float acosAngle = Clamp(Dot(localPos, gContext.mRotationVectorSource), -0.9999f, 0.9999f);
      float angle = acosf(acosAngle);
      angle *= (Dot(localPos, perpendicularVector) < 0.f) ? 1.f : -1.f;
      return angle;
   }